

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O1

void __thiscall testing::InSequence::~InSequence(InSequence *this)

{
  linked_ptr<testing::Expectation> *this_00;
  Sequence **ppSVar1;
  
  if (this->sequence_created_ == true) {
    ppSVar1 = internal::ThreadLocal<testing::Sequence_*>::GetOrCreateValue
                        ((ThreadLocal<testing::Sequence_*> *)internal::g_gmock_implicit_sequence);
    this_00 = &(*ppSVar1)->last_expectation_;
    if (this_00 != (linked_ptr<testing::Expectation> *)0x0) {
      internal::linked_ptr<testing::Expectation>::depart(this_00);
      operator_delete(this_00);
    }
    ppSVar1 = internal::ThreadLocal<testing::Sequence_*>::GetOrCreateValue
                        ((ThreadLocal<testing::Sequence_*> *)internal::g_gmock_implicit_sequence);
    *ppSVar1 = (Sequence *)0x0;
  }
  return;
}

Assistant:

InSequence::~InSequence() {
  if (sequence_created_) {
    delete internal::g_gmock_implicit_sequence.get();
    internal::g_gmock_implicit_sequence.set(NULL);
  }
}